

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
QLearning::IndexFromMulti
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,QLearning *this,
          int one_dimensional_index,int nn,int depth)

{
  pointer piVar1;
  ulong uVar2;
  allocator_type local_2d;
  value_type local_2c;
  
  local_2c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)depth,&local_2c,&local_2d);
  if (0 < depth) {
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      piVar1[uVar2] = one_dimensional_index % nn;
      uVar2 = uVar2 + 1;
      one_dimensional_index = one_dimensional_index / nn;
    } while ((uint)depth != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> QLearning::IndexFromMulti(int one_dimensional_index, int nn, int depth)
{
    std::vector<int> index(depth, 0);
    for (int i = 0; i < depth; i++)
    {
        index[i] = (one_dimensional_index % nn);
        one_dimensional_index /= nn;
    }
    return index;
}